

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O0

Allocation __thiscall
Diligent::VariableSizeAllocationsManager::Allocate
          (VariableSizeAllocationsManager *this,OffsetType Size,OffsetType Alignment)

{
  _Rb_tree_color *p_Var1;
  bool bVar2;
  Char *pCVar3;
  type val;
  pointer ppVar4;
  pointer ppVar5;
  type tVar6;
  OffsetType OVar7;
  unsigned_long *puVar8;
  char (*pacVar9) [57];
  char (*Args_1) [57];
  char (*in_RCX) [9];
  char (*Args_1_00) [59];
  VariableSizeAllocationsManager *Args_1_01;
  char (*in_R8) [21];
  _Base_ptr local_1f0;
  undefined1 local_1d0 [8];
  string msg_8;
  string msg_7;
  undefined1 local_170 [8];
  string msg_6;
  OffsetType NewSize;
  OffsetType NewOffset;
  string msg_5;
  OffsetType AdjustedSize;
  OffsetType AlignedOffset;
  string msg_4;
  OffsetType Offset;
  string msg_3;
  string msg_2;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
  SmallestBlockIt;
  key_type_conflict local_98;
  _Self local_90;
  iterator SmallestBlockItIt;
  OffsetType AlignmentReserve;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  OffsetType Alignment_local;
  OffsetType Size_local;
  VariableSizeAllocationsManager *this_local;
  
  msg.field_2._8_8_ = Alignment;
  if (Size == 0) {
    FormatString<char[26],char[9]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcd22bc,
               in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0xd0);
    std::__cxx11::string::~string((string *)local_50);
  }
  bVar2 = IsPowerOfTwo<unsigned_long>(msg.field_2._8_8_);
  if (!bVar2) {
    FormatString<char[12],unsigned_long,char[21]>
              ((string *)&AlignmentReserve,(Diligent *)"Alignment (",
               (char (*) [12])((long)&msg.field_2 + 8),(unsigned_long *)") must be power of 2",in_R8
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0xd1);
    std::__cxx11::string::~string((string *)&AlignmentReserve);
  }
  val = AlignUp<unsigned_long,unsigned_long>(Size,msg.field_2._8_8_);
  if (this->m_FreeSize < val) {
    _this_local = Allocation::InvalidAllocation();
  }
  else {
    if (this->m_CurrAlignment < (ulong)msg.field_2._8_8_) {
      local_1f0 = (_Base_ptr)(msg.field_2._8_8_ - this->m_CurrAlignment);
    }
    else {
      local_1f0 = (_Base_ptr)0x0;
    }
    SmallestBlockItIt._M_node = local_1f0;
    local_98 = (long)&local_1f0->_M_color + val;
    local_90._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
         ::lower_bound(&this->m_FreeBlocksBySize,&local_98);
    SmallestBlockIt._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
         ::end(&this->m_FreeBlocksBySize);
    bVar2 = std::operator==(&local_90,(_Self *)&SmallestBlockIt);
    if (bVar2) {
      _this_local = Allocation::InvalidAllocation();
    }
    else {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
               ::operator->(&local_90);
      msg_2.field_2._8_8_ = (ppVar4->second)._M_node;
      p_Var1 = &(SmallestBlockItIt._M_node)->_M_color;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                             *)((long)&msg_2.field_2 + 8));
      if ((ppVar5->second).Size < (long)p_Var1 + val) {
        FormatString<char[26],char[56]>
                  ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Size + AlignmentReserve <= SmallestBlockIt->second.Size",
                   (char (*) [56])ppVar5);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xdf);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                             *)((long)&msg_2.field_2 + 8));
      OVar7 = (ppVar5->second).Size;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
               ::operator->(&local_90);
      if (OVar7 != ppVar4->first) {
        FormatString<char[26],char[57]>
                  ((string *)&Offset,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SmallestBlockIt->second.Size == SmallestBlockItIt->first",
                   (char (*) [57])ppVar4);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xe0);
        std::__cxx11::string::~string((string *)&Offset);
      }
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                             *)((long)&msg_2.field_2 + 8));
      msg_4.field_2._8_8_ = ppVar5->first;
      if ((ulong)msg_4.field_2._8_8_ % this->m_CurrAlignment != 0) {
        FormatString<char[26],char[30]>
                  ((string *)&AlignedOffset,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Offset % m_CurrAlignment == 0",(char (*) [30])this);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xea);
        std::__cxx11::string::~string((string *)&AlignedOffset);
      }
      tVar6 = AlignUp<unsigned_long,unsigned_long>(msg_4.field_2._8_8_,msg.field_2._8_8_);
      msg_5.field_2._8_8_ = val + (tVar6 - msg_4.field_2._8_8_);
      Args_1_00 = (char (*) [59])((long)&(SmallestBlockItIt._M_node)->_M_color + val);
      if (Args_1_00 < (ulong)msg_5.field_2._8_8_) {
        FormatString<char[26],char[40]>
                  ((string *)&NewOffset,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"AdjustedSize <= Size + AlignmentReserve",(char (*) [40])Args_1_00
                  );
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        Args_1_00 = (char (*) [59])0xed;
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xed);
        std::__cxx11::string::~string((string *)&NewOffset);
      }
      OVar7 = msg_4.field_2._8_8_ + msg_5.field_2._8_8_;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                             *)((long)&msg_2.field_2 + 8));
      msg_6.field_2._8_8_ = (ppVar5->second).Size - msg_5.field_2._8_8_;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                             *)((long)&msg_2.field_2 + 8));
      bVar2 = std::operator==(&local_90,&(ppVar5->second).OrderBySizeIt);
      if (!bVar2) {
        FormatString<char[26],char[59]>
                  ((string *)local_170,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SmallestBlockItIt == SmallestBlockIt->second.OrderBySizeIt",
                   Args_1_00);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xf0);
        std::__cxx11::string::~string((string *)local_170);
      }
      std::
      multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
      ::erase_abi_cxx11_((multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                          *)&this->m_FreeBlocksBySize,(iterator)local_90._M_node);
      std::
      map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
      ::erase_abi_cxx11_((map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                          *)this,(iterator)msg_2.field_2._8_8_);
      if (msg_6.field_2._8_8_ != 0) {
        AddNewBlock(this,OVar7,msg_6.field_2._8_8_);
      }
      this->m_FreeSize = this->m_FreeSize - msg_5.field_2._8_8_;
      Args_1_01 = (VariableSizeAllocationsManager *)(this->m_CurrAlignment - 1);
      if ((val & (ulong)Args_1_01) != 0) {
        bVar2 = IsPowerOfTwo<unsigned_long>(val);
        if (bVar2) {
          if ((val < (ulong)msg.field_2._8_8_) || (Args_1_01 = this, this->m_CurrAlignment <= val))
          {
            FormatString<char[26],char[44]>
                      ((string *)((long)&msg_8.field_2 + 8),(Diligent *)"Debug expression failed:\n"
                       ,(char (*) [26])"Size >= Alignment && Size < m_CurrAlignment",
                       (char (*) [44])Args_1_01);
            pCVar3 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar3,"Allocate",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                       ,0xfe);
            std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
          }
          this->m_CurrAlignment = val;
        }
        else {
          puVar8 = std::min<unsigned_long>
                             (&this->m_CurrAlignment,(unsigned_long *)(msg.field_2._M_local_buf + 8)
                             );
          this->m_CurrAlignment = *puVar8;
        }
      }
      pacVar9 = (char (*) [57])
                std::
                map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                ::size(&this->m_FreeBlocksByOffset);
      Args_1 = (char (*) [57])
               std::
               multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
               ::size(&this->m_FreeBlocksBySize);
      if (pacVar9 != Args_1) {
        FormatString<char[26],char[57]>
                  ((string *)local_1d0,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",Args_1)
        ;
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x108);
        std::__cxx11::string::~string((string *)local_1d0);
      }
      if ((this->m_DbgDisableDebugValidation & 1U) == 0) {
        DbgVerifyList(this);
      }
      Allocation::Allocation((Allocation *)&this_local,msg_4.field_2._8_8_,msg_5.field_2._8_8_);
    }
  }
  return _this_local;
}

Assistant:

Allocation Allocate(OffsetType Size, OffsetType Alignment)
    {
        VERIFY_EXPR(Size > 0);
        VERIFY(IsPowerOfTwo(Alignment), "Alignment (", Alignment, ") must be power of 2");
        Size = AlignUp(Size, Alignment);
        if (m_FreeSize < Size)
            return Allocation::InvalidAllocation();

        OffsetType AlignmentReserve = (Alignment > m_CurrAlignment) ? Alignment - m_CurrAlignment : 0;
        // Get the first block that is large enough to encompass Size + AlignmentReserve bytes
        // lower_bound() returns an iterator pointing to the first element that
        // is not less (i.e. >= ) than key
        auto SmallestBlockItIt = m_FreeBlocksBySize.lower_bound(Size + AlignmentReserve);
        if (SmallestBlockItIt == m_FreeBlocksBySize.end())
            return Allocation::InvalidAllocation();

        auto SmallestBlockIt = SmallestBlockItIt->second;
        VERIFY_EXPR(Size + AlignmentReserve <= SmallestBlockIt->second.Size);
        VERIFY_EXPR(SmallestBlockIt->second.Size == SmallestBlockItIt->first);

        //     SmallestBlockIt.Offset
        //        |                                  |
        //        |<------SmallestBlockIt.Size------>|
        //        |<------Size------>|<---NewSize--->|
        //        |                  |
        //      Offset              NewOffset
        //
        OffsetType Offset = SmallestBlockIt->first;
        VERIFY_EXPR(Offset % m_CurrAlignment == 0);
        OffsetType AlignedOffset = AlignUp(Offset, Alignment);
        OffsetType AdjustedSize  = Size + (AlignedOffset - Offset);
        VERIFY_EXPR(AdjustedSize <= Size + AlignmentReserve);
        OffsetType NewOffset = Offset + AdjustedSize;
        OffsetType NewSize   = SmallestBlockIt->second.Size - AdjustedSize;
        VERIFY_EXPR(SmallestBlockItIt == SmallestBlockIt->second.OrderBySizeIt);
        m_FreeBlocksBySize.erase(SmallestBlockItIt);
        m_FreeBlocksByOffset.erase(SmallestBlockIt);
        if (NewSize > 0)
        {
            AddNewBlock(NewOffset, NewSize);
        }

        m_FreeSize -= AdjustedSize;

        if ((Size & (m_CurrAlignment - 1)) != 0)
        {
            if (IsPowerOfTwo(Size))
            {
                VERIFY_EXPR(Size >= Alignment && Size < m_CurrAlignment);
                m_CurrAlignment = Size;
            }
            else
            {
                m_CurrAlignment = (std::min)(m_CurrAlignment, Alignment);
            }
        }

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        if (!m_DbgDisableDebugValidation)
            DbgVerifyList();
#endif
        return Allocation{Offset, AdjustedSize};
    }